

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.cpp
# Opt level: O2

void __thiscall OpenMD::Sticky::addType(Sticky *this,AtomType *atomType)

{
  undefined8 *puVar1;
  size_t sVar2;
  RealType RVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  bool bVar7;
  CubicSpline *this_00;
  CubicSpline *this_01;
  long lVar8;
  int iVar9;
  long lVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 uVar11;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar12;
  int atid;
  StickyAdapter sticky2;
  StickyAdapter sticky1;
  uint local_12c;
  undefined1 local_128 [16];
  double local_118;
  double local_110;
  double local_108;
  StickyAdapter local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  long local_c0;
  long local_b8;
  size_t local_b0;
  _Base_ptr local_a8;
  long local_a0;
  _Base_ptr local_98;
  StickyAdapter local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_90.at_ = atomType;
  local_12c = AtomType::getIdent(atomType);
  sVar2 = (this->Stypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar12 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->Stypes,(int *)&local_12c);
  if (pVar12.second == false) {
    snprintf(painCave.errMsg,2000,"Sticky already had a previous entry with ident %d\n",
             (ulong)local_12c);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  iVar9 = (int)sVar2;
  (this->Stids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)local_12c] = iVar9;
  lVar10 = (long)iVar9;
  local_b8 = lVar10 * 0x18;
  local_b0 = sVar2;
  std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar10,(long)this->nSticky_);
  local_a8 = &(this->Stypes)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c0 = lVar10 * 0x58;
  for (local_98 = (this->Stypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_98 != local_a8; local_98 = (_Base_ptr)std::_Rb_tree_increment(local_98)) {
    local_a0 = (long)(this->Stids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)local_98[1]._M_color];
    local_100.at_ = ForceField::getAtomType(this->forceField_,local_98[1]._M_color);
    RVar3 = StickyAdapter::getRl(&local_90);
    local_f8._8_4_ = extraout_XMM0_Dc;
    local_f8._0_8_ = RVar3;
    local_f8._12_4_ = extraout_XMM0_Dd;
    RVar3 = StickyAdapter::getRl(&local_100);
    local_d8._8_4_ = extraout_XMM0_Dc_00;
    local_d8._0_8_ = RVar3;
    local_d8._12_4_ = extraout_XMM0_Dd_00;
    RVar3 = StickyAdapter::getRu(&local_90);
    local_48._8_4_ = extraout_XMM0_Dc_01;
    local_48._0_8_ = RVar3;
    local_48._12_4_ = extraout_XMM0_Dd_01;
    RVar3 = StickyAdapter::getRu(&local_100);
    local_58._8_4_ = extraout_XMM0_Dc_02;
    local_58._0_8_ = RVar3;
    local_58._12_4_ = extraout_XMM0_Dd_02;
    RVar3 = StickyAdapter::getRlp(&local_90);
    local_68._8_4_ = extraout_XMM0_Dc_03;
    local_68._0_8_ = RVar3;
    local_68._12_4_ = extraout_XMM0_Dd_03;
    RVar3 = StickyAdapter::getRlp(&local_100);
    local_e8._8_4_ = extraout_XMM0_Dc_04;
    local_e8._0_8_ = RVar3;
    local_e8._12_4_ = extraout_XMM0_Dd_04;
    RVar3 = StickyAdapter::getRup(&local_90);
    local_78._8_4_ = extraout_XMM0_Dc_05;
    local_78._0_8_ = RVar3;
    local_78._12_4_ = extraout_XMM0_Dd_05;
    RVar3 = StickyAdapter::getRup(&local_100);
    local_88._8_4_ = extraout_XMM0_Dc_06;
    local_88._0_8_ = RVar3;
    local_88._12_4_ = extraout_XMM0_Dd_06;
    RVar3 = StickyAdapter::getW0(&local_90);
    local_128._0_8_ = RVar3;
    RVar3 = StickyAdapter::getW0(&local_100);
    dVar4 = RVar3 * (double)local_128._0_8_;
    if (dVar4 < 0.0) {
      local_108 = sqrt(dVar4);
    }
    else {
      local_108 = SQRT(dVar4);
    }
    RVar3 = StickyAdapter::getV0(&local_90);
    local_128._0_8_ = RVar3;
    RVar3 = StickyAdapter::getV0(&local_100);
    dVar4 = RVar3 * (double)local_128._0_8_;
    if (dVar4 < 0.0) {
      local_110 = sqrt(dVar4);
    }
    else {
      local_110 = SQRT(dVar4);
    }
    RVar3 = StickyAdapter::getV0p(&local_90);
    local_128._0_8_ = RVar3;
    RVar3 = StickyAdapter::getV0p(&local_100);
    dVar4 = RVar3 * (double)local_128._0_8_;
    if (dVar4 < 0.0) {
      local_118 = sqrt(dVar4);
    }
    else {
      local_118 = SQRT(dVar4);
    }
    bVar7 = StickyAdapter::isStickyPower(&local_90);
    if (bVar7) {
      bVar7 = StickyAdapter::isStickyPower(&local_100);
    }
    else {
      bVar7 = false;
    }
    this_00 = (CubicSpline *)operator_new(0xa0);
    CubicSpline::CubicSpline(this_00);
    dVar4 = ((double)local_d8._0_8_ + (double)local_f8._0_8_) * 0.5;
    dVar5 = ((double)local_58._0_8_ + (double)local_48._0_8_) * 0.5;
    uVar11 = (undefined4)((ulong)dVar5 >> 0x20);
    local_128._8_4_ = SUB84(dVar5,0);
    local_128._0_8_ = dVar5;
    local_128._12_4_ = uVar11;
    local_d8._8_4_ = SUB84(dVar5,0);
    local_d8._0_8_ = dVar4;
    local_d8._12_4_ = uVar11;
    CubicSpline::addPoint(this_00,dVar4,1.0);
    CubicSpline::addPoint(this_00,(RealType)local_128._0_8_,0.0);
    this_01 = (CubicSpline *)operator_new(0xa0);
    CubicSpline::CubicSpline(this_01);
    dVar4 = ((double)local_e8._0_8_ + (double)local_68._0_8_) * 0.5;
    local_f8._8_8_ = ((double)local_88._0_8_ + (double)local_78._0_8_) * 0.5;
    uVar11 = (undefined4)((ulong)local_f8._8_8_ >> 0x20);
    local_e8._8_4_ = (int)local_f8._8_8_;
    local_e8._0_8_ = dVar4;
    local_e8._12_4_ = uVar11;
    local_f8._0_8_ = local_f8._8_8_;
    dVar5 = (double)local_f8._8_8_;
    if ((double)local_f8._8_8_ <= (double)local_128._0_8_) {
      dVar5 = (double)local_128._0_8_;
    }
    local_128._8_4_ = (int)local_f8._8_8_;
    local_128._0_8_ = dVar5;
    local_128._12_4_ = uVar11;
    CubicSpline::addPoint(this_01,dVar4,1.0);
    CubicSpline::addPoint(this_01,(RealType)local_f8._0_8_,0.0);
    lVar6 = local_a0;
    std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>::
    resize((this->MixingMap).
           super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + local_a0,(long)this->nSticky_);
    lVar10 = *(long *)((long)&(((this->MixingMap).
                                super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>
                              )._M_impl.super__Vector_impl_data + local_b8);
    lVar8 = lVar6 * 0x58;
    *(undefined8 *)(lVar10 + lVar8) = local_d8._0_8_;
    ((undefined8 *)(lVar10 + lVar8))[1] = local_d8._8_8_;
    puVar1 = (undefined8 *)(lVar10 + 0x10 + lVar8);
    *puVar1 = local_e8._0_8_;
    puVar1[1] = local_e8._8_8_;
    *(undefined8 *)(lVar10 + 0x20 + lVar8) = local_128._0_8_;
    *(double *)(lVar10 + 0x28 + lVar8) = local_108;
    *(double *)(lVar10 + 0x30 + lVar8) = local_110;
    *(double *)(lVar10 + 0x38 + lVar8) = local_118;
    *(CubicSpline **)(lVar10 + 0x40 + lVar8) = this_00;
    *(CubicSpline **)(lVar10 + 0x48 + lVar8) = this_01;
    *(bool *)(lVar10 + 0x50 + lVar8) = bVar7;
    if ((int)lVar6 != (int)local_b0) {
      lVar10 = *(long *)&(this->MixingMap).
                         super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar6].
                         super__Vector_base<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>
                         ._M_impl.super__Vector_impl_data;
      *(undefined8 *)(lVar10 + local_c0) = local_d8._0_8_;
      ((undefined8 *)(lVar10 + local_c0))[1] = local_d8._8_8_;
      puVar1 = (undefined8 *)(lVar10 + 0x10 + local_c0);
      *puVar1 = local_e8._0_8_;
      puVar1[1] = local_e8._8_8_;
      *(undefined8 *)(lVar10 + 0x20 + local_c0) = local_128._0_8_;
      *(double *)(lVar10 + 0x28 + local_c0) = local_108;
      *(double *)(lVar10 + 0x30 + local_c0) = local_110;
      *(double *)(lVar10 + 0x38 + local_c0) = local_118;
      *(CubicSpline **)(lVar10 + 0x40 + local_c0) = this_00;
      *(CubicSpline **)(lVar10 + 0x48 + local_c0) = this_01;
      *(bool *)(lVar10 + 0x50 + local_c0) = bVar7;
    }
  }
  return;
}

Assistant:

void Sticky::addType(AtomType* atomType) {
    StickyAdapter sticky1 = StickyAdapter(atomType);

    // add it to the map:

    int atid = atomType->getIdent();
    int stid = Stypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = Stypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Sticky already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    Stids[atid] = stid;
    MixingMap[stid].resize(nSticky_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = Stypes.begin(); it != Stypes.end(); ++it) {
      int stid2             = Stids[(*it)];
      AtomType* atype2      = forceField_->getAtomType((*it));
      StickyAdapter sticky2 = StickyAdapter(atype2);

      StickyInteractionData mixer;

      // Mixing two different sticky types is silly, but if you want 2
      // sticky types in your simulation, we'll let you do it with the
      // Lorentz- Berthelot mixing rules (which happen to do the right thing
      // when atomType and atype2 happen to be the same.

      mixer.rl      = 0.5 * (sticky1.getRl() + sticky2.getRl());
      mixer.ru      = 0.5 * (sticky1.getRu() + sticky2.getRu());
      mixer.rlp     = 0.5 * (sticky1.getRlp() + sticky2.getRlp());
      mixer.rup     = 0.5 * (sticky1.getRup() + sticky2.getRup());
      mixer.rbig    = max(mixer.ru, mixer.rup);
      mixer.w0      = sqrt(sticky1.getW0() * sticky2.getW0());
      mixer.v0      = sqrt(sticky1.getV0() * sticky2.getV0());
      mixer.v0p     = sqrt(sticky1.getV0p() * sticky2.getV0p());
      mixer.isPower = sticky1.isStickyPower() && sticky2.isStickyPower();

      CubicSpline* s = new CubicSpline();
      s->addPoint(mixer.rl, 1.0);
      s->addPoint(mixer.ru, 0.0);
      mixer.s = s;

      CubicSpline* sp = new CubicSpline();
      sp->addPoint(mixer.rlp, 1.0);
      sp->addPoint(mixer.rup, 0.0);
      mixer.sp = sp;

      MixingMap[stid2].resize(nSticky_);

      MixingMap[stid][stid2] = mixer;
      if (stid2 != stid) { MixingMap[stid2][stid] = mixer; }
    }
  }